

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::flush_all_atomic_capable_variables(Compiler *this)

{
  uint *puVar1;
  size_t sVar2;
  SPIRVariable *var;
  long lVar3;
  
  puVar1 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
  sVar2 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
  for (lVar3 = 0; sVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    var = get<spirv_cross::SPIRVariable>(this,*(uint32_t *)((long)puVar1 + lVar3));
    flush_dependees(this,var);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_atomic_capable_variables()
{
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));
	flush_all_aliased_variables();
}